

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConcurrentAssertionStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConcurrentAssertionStatement,slang::ast::AssertionKind&,slang::ast::AssertionExpr_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,AssertionKind *args,AssertionExpr *args_1,Statement **args_2,
          Statement **args_3,SourceRange *args_4)

{
  SourceRange sourceRange;
  ConcurrentAssertionStatement *pCVar1;
  ConcurrentAssertionStatement *in_RCX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  undefined8 in_R8;
  AssertionKind assertionKind;
  AssertionExpr *in_R9;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  assertionKind = (AssertionKind)((ulong)in_R8 >> 0x20);
  pCVar1 = (ConcurrentAssertionStatement *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  ast::ConcurrentAssertionStatement::ConcurrentAssertionStatement
            (in_RCX,assertionKind,in_R9,(Statement *)in_R9->syntax,*(Statement **)in_R9,sourceRange)
  ;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }